

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::EachMatcher<iutest::detail::EachMatcher<iutest::detail::GtMatcher<int>>>::operator()
          (AssertionResult *__return_storage_ptr__,
          EachMatcher<iutest::detail::EachMatcher<iutest::detail::GtMatcher<int>>> *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *actual)

{
  bool bVar1;
  AssertionResult *rhs;
  string local_78;
  AssertionResult local_58;
  vector<int,_std::allocator<int>_> *local_30;
  __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  local_28;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_20;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *actual_local;
  EachMatcher<iutest::detail::EachMatcher<iutest::detail::GtMatcher<int>_>_> *this_local;
  
  local_20 = actual;
  actual_local = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)this;
  this_local = (EachMatcher<iutest::detail::EachMatcher<iutest::detail::GtMatcher<int>_>_> *)
               __return_storage_ptr__;
  local_28._M_current =
       (vector<int,_std::allocator<int>_> *)
       std::
       begin<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                 (actual);
  local_30 = (vector<int,_std::allocator<int>_> *)
             std::
             end<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                       (local_20);
  bVar1 = Each<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
                    (this,local_28,
                     (__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                      )local_30);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_78,this);
    rhs = AssertionResult::operator<<(&local_58,&local_78);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_78);
    AssertionResult::~AssertionResult(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Each(begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }